

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileiconprovider.cpp
# Opt level: O0

QIcon __thiscall
QFileIconProviderPrivate::getIcon(QFileIconProviderPrivate *this,StandardPixmap name)

{
  ulong uVar1;
  QStyle *pQVar2;
  undefined4 in_EDX;
  QIcon *in_RSI;
  QIconPrivate *in_RDI;
  long in_FS_OFFSET;
  QIconPrivate *pQVar3;
  QIcon local_68;
  QIcon local_60;
  QIcon local_58;
  QIcon local_50;
  QIcon local_48;
  QIcon local_40;
  QIcon local_38;
  QIcon local_30;
  QIcon local_28;
  QIcon local_20;
  QIcon local_18;
  QIcon local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  switch(in_EDX) {
  case 0xd:
    uVar1 = QIcon::isNull();
    if ((uVar1 & 1) != 0) {
      pQVar2 = QApplication::style();
      (**(code **)(*(long *)pQVar2 + 0x100))(&local_58,pQVar2,in_EDX,0);
      QIcon::operator=(in_RSI,(QIcon *)pQVar3);
      QIcon::~QIcon(&local_58);
    }
    QIcon::QIcon((QIcon *)in_RDI,(QIcon *)(in_RSI + 0x11));
    break;
  case 0xe:
    uVar1 = QIcon::isNull();
    if ((uVar1 & 1) != 0) {
      pQVar2 = QApplication::style();
      (**(code **)(*(long *)pQVar2 + 0x100))(&local_60,pQVar2,in_EDX,0);
      QIcon::operator=(in_RSI,(QIcon *)pQVar3);
      QIcon::~QIcon(&local_60);
    }
    QIcon::QIcon((QIcon *)in_RDI,(QIcon *)(in_RSI + 0x12));
    break;
  case 0xf:
    uVar1 = QIcon::isNull();
    if ((uVar1 & 1) != 0) {
      pQVar2 = QApplication::style();
      (**(code **)(*(long *)pQVar2 + 0x100))(&local_50,pQVar2,in_EDX,0);
      QIcon::operator=(in_RSI,(QIcon *)pQVar3);
      QIcon::~QIcon(&local_50);
    }
    QIcon::QIcon((QIcon *)in_RDI,(QIcon *)(in_RSI + 0x10));
    break;
  case 0x10:
    uVar1 = QIcon::isNull();
    if ((uVar1 & 1) != 0) {
      pQVar2 = QApplication::style();
      (**(code **)(*(long *)pQVar2 + 0x100))(&local_38,pQVar2,in_EDX,0);
      QIcon::operator=(in_RSI,(QIcon *)pQVar3);
      QIcon::~QIcon(&local_38);
    }
    QIcon::QIcon((QIcon *)in_RDI,(QIcon *)(in_RSI + 0xc));
    break;
  case 0x11:
    uVar1 = QIcon::isNull();
    if ((uVar1 & 1) != 0) {
      pQVar2 = QApplication::style();
      (**(code **)(*(long *)pQVar2 + 0x100))(&local_30,pQVar2,in_EDX,0);
      QIcon::operator=(in_RSI,(QIcon *)pQVar3);
      QIcon::~QIcon(&local_30);
    }
    QIcon::QIcon((QIcon *)in_RDI,(QIcon *)(in_RSI + 0xb));
    break;
  case 0x12:
    uVar1 = QIcon::isNull();
    if ((uVar1 & 1) != 0) {
      pQVar2 = QApplication::style();
      (**(code **)(*(long *)pQVar2 + 0x100))(&local_40,pQVar2,in_EDX,0);
      QIcon::operator=(in_RSI,(QIcon *)pQVar3);
      QIcon::~QIcon(&local_40);
    }
    QIcon::QIcon((QIcon *)in_RDI,(QIcon *)(in_RSI + 0xd));
    break;
  default:
    QIcon::QIcon((QIcon *)in_RDI);
    pQVar3 = in_RDI;
    break;
  case 0x14:
    uVar1 = QIcon::isNull();
    if ((uVar1 & 1) != 0) {
      pQVar2 = QApplication::style();
      (**(code **)(*(long *)pQVar2 + 0x100))(&local_48,pQVar2,in_EDX,0);
      QIcon::operator=(in_RSI,(QIcon *)pQVar3);
      QIcon::~QIcon(&local_48);
    }
    QIcon::QIcon((QIcon *)in_RDI,(QIcon *)(in_RSI + 0xf));
    break;
  case 0x17:
    uVar1 = QIcon::isNull();
    if ((uVar1 & 1) != 0) {
      pQVar2 = QApplication::style();
      (**(code **)(*(long *)pQVar2 + 0x100))(&local_28,pQVar2,in_EDX,0);
      QIcon::operator=(in_RSI,(QIcon *)pQVar3);
      QIcon::~QIcon(&local_28);
    }
    QIcon::QIcon((QIcon *)in_RDI,(QIcon *)(in_RSI + 10));
    break;
  case 0x19:
    uVar1 = QIcon::isNull();
    if ((uVar1 & 1) != 0) {
      pQVar2 = QApplication::style();
      (**(code **)(*(long *)pQVar2 + 0x100))(&local_10,pQVar2,in_EDX,0);
      QIcon::operator=(in_RSI,(QIcon *)pQVar3);
      QIcon::~QIcon(&local_10);
    }
    QIcon::QIcon((QIcon *)in_RDI,(QIcon *)(in_RSI + 7));
    break;
  case 0x1a:
    uVar1 = QIcon::isNull();
    if ((uVar1 & 1) != 0) {
      pQVar2 = QApplication::style();
      (**(code **)(*(long *)pQVar2 + 0x100))(&local_18,pQVar2,in_EDX,0);
      QIcon::operator=(in_RSI,(QIcon *)pQVar3);
      QIcon::~QIcon(&local_18);
    }
    QIcon::QIcon((QIcon *)in_RDI,(QIcon *)(in_RSI + 8));
    break;
  case 0x26:
    uVar1 = QIcon::isNull();
    if ((uVar1 & 1) != 0) {
      pQVar2 = QApplication::style();
      (**(code **)(*(long *)pQVar2 + 0x100))(&local_20,pQVar2,in_EDX,0);
      QIcon::operator=(in_RSI,(QIcon *)pQVar3);
      QIcon::~QIcon(&local_20);
    }
    QIcon::QIcon((QIcon *)in_RDI,(QIcon *)(in_RSI + 9));
    break;
  case 0x38:
    uVar1 = QIcon::isNull();
    if ((uVar1 & 1) != 0) {
      pQVar2 = QApplication::style();
      (**(code **)(*(long *)pQVar2 + 0x100))(&local_68,pQVar2,in_EDX,0);
      QIcon::operator=(in_RSI,(QIcon *)pQVar3);
      QIcon::~QIcon(&local_68);
    }
    QIcon::QIcon((QIcon *)in_RDI,(QIcon *)(in_RSI + 0x14));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QIcon)pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QFileIconProviderPrivate::getIcon(QStyle::StandardPixmap name) const
{
    switch (name) {
    case QStyle::SP_FileIcon:
        if (file.isNull())
            file = QApplication::style()->standardIcon(name);
        return file;
    case QStyle::SP_FileLinkIcon:
        if (fileLink.isNull())
            fileLink = QApplication::style()->standardIcon(name);
        return fileLink;
    case QStyle::SP_DirIcon:
        if (directory.isNull())
            directory = QApplication::style()->standardIcon(name);
        return directory;
    case QStyle::SP_DirLinkIcon:
        if (directoryLink.isNull())
            directoryLink = QApplication::style()->standardIcon(name);
        return directoryLink;
    case QStyle::SP_DriveHDIcon:
        if (harddisk.isNull())
            harddisk = QApplication::style()->standardIcon(name);
        return harddisk;
    case QStyle::SP_DriveFDIcon:
        if (floppy.isNull())
            floppy = QApplication::style()->standardIcon(name);
        return floppy;
    case QStyle::SP_DriveCDIcon:
        if (cdrom.isNull())
            cdrom = QApplication::style()->standardIcon(name);
        return cdrom;
    case QStyle::SP_DriveNetIcon:
        if (network.isNull())
            network = QApplication::style()->standardIcon(name);
        return network;
    case QStyle::SP_ComputerIcon:
        if (computer.isNull())
            computer = QApplication::style()->standardIcon(name);
        return computer;
    case QStyle::SP_DesktopIcon:
        if (desktop.isNull())
            desktop = QApplication::style()->standardIcon(name);
        return desktop;
    case QStyle::SP_TrashIcon:
        if (trashcan.isNull())
            trashcan = QApplication::style()->standardIcon(name);
        return trashcan;
    case QStyle::SP_DirHomeIcon:
        if (home.isNull())
            home = QApplication::style()->standardIcon(name);
        return home;
    default:
        return QIcon();
    }
    return QIcon();
}